

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int properties_get_to(PROPERTIES_HANDLE properties,AMQP_VALUE *to_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar3 = 0x3f44;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(properties->composite_value,&local_1c);
    iVar3 = 0x3f4c;
    if ((iVar1 == 0) && (iVar3 = 0x3f52, 2 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(properties->composite_value,2);
      iVar3 = 0x3f5a;
      if (value != (AMQP_VALUE)0x0) {
        AVar2 = amqpvalue_get_type(value);
        if (AVar2 != AMQP_TYPE_NULL) {
          *to_value = value;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int properties_get_to(PROPERTIES_HANDLE properties, AMQP_VALUE* to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        if (amqpvalue_get_composite_item_count(properties_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(properties_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *to_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}